

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsValidTest::getValueList_abi_cxx11_
          (string *__return_storage_ptr__,ImplicitConversionsValidTest *this,GLuint n_columns,
          GLuint n_rows)

{
  undefined4 local_28;
  GLuint i;
  GLuint n_rows_local;
  GLuint n_columns_local;
  ImplicitConversionsValidTest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0; local_28 < n_columns * n_rows; local_28 = local_28 + 1) {
    if (local_28 == n_columns * n_rows - 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImplicitConversionsValidTest::getValueList(glw::GLuint n_columns, glw::GLuint n_rows)
{
	std::string result;

	for (GLuint i = 0; i < n_columns * n_rows; ++i)
	{
		if (i != n_columns * n_rows - 1)
		{
			result.append("1, ");
		}
		else
		{
			result.append("1");
		}
	}

	return result;
}